

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shared_alloc.hpp
# Opt level: O3

LO __thiscall Omega_h::Read<signed_char>::size(Read<signed_char> *this)

{
  Alloc *pAVar1;
  
  pAVar1 = (this->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    return (LO)pAVar1->size;
  }
  return (LO)((ulong)pAVar1 >> 3);
}

Assistant:

const noexcept {
#ifndef __CUDA_ARCH__
    if (!(reinterpret_cast<std::uintptr_t>(alloc) & IN_PARALLEL)) {
#if defined(__GNUC__) && (__GNUC__ >= 7) && (!defined(__clang__))
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wnull-dereference"
#endif
      return alloc->size;
#if defined(__GNUC__) && (__GNUC__ >= 7) && (!defined(__clang__))
#pragma GCC diagnostic pop
#endif
    }
#endif
    return reinterpret_cast<std::uintptr_t>(alloc) >> 3;
  }